

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

uint64 mkvmuxer::EbmlElementSize(uint64 type,uint64 value,uint64 fixed_size)

{
  long lVar1;
  
  lVar1 = 2;
  if ((((0xff < type) && (lVar1 = 3, 0xffff < type)) && (lVar1 = 4, 0xffffff < type)) &&
     (((lVar1 = 5, type >> 0x20 != 0 && (lVar1 = 6, type >> 0x28 != 0)) &&
      (lVar1 = 7, type >> 0x30 != 0)))) {
    lVar1 = 9 - (ulong)(type >> 0x38 == 0);
  }
  if (((fixed_size == 0) && (fixed_size = 1, 0xff < value)) &&
     (((fixed_size = 2, 0xffff < value &&
       (((fixed_size = 3, 0xffffff < value && (fixed_size = 4, value >> 0x20 != 0)) &&
        (fixed_size = 5, value >> 0x28 != 0)))) && (fixed_size = 6, value >> 0x30 != 0)))) {
    fixed_size = 8 - (ulong)(value >> 0x38 == 0);
  }
  return lVar1 + fixed_size;
}

Assistant:

uint64 EbmlElementSize(uint64 type, uint64 value, uint64 fixed_size) {
  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += (fixed_size > 0) ? fixed_size : GetUIntSize(value);

  // Size of Datasize
  ebml_size++;

  return ebml_size;
}